

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::ChromeCompositorStateMachine::Serialize
          (ChromeCompositorStateMachine *this,Message *msg)

{
  _Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_false> this_00;
  _Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_false> this_01;
  uint8_t *src_begin;
  Message *pMVar1;
  ulong uVar2;
  
  uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar2 & 2) != 0) {
    this_00._M_head_impl =
         (this->major_state_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState>_>
         .
         super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_false>
         ._M_head_impl;
    pMVar1 = protozero::Message::BeginNestedMessageInternal(msg,1);
    ChromeCompositorStateMachine_MajorState::Serialize(this_00._M_head_impl,pMVar1);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 4) != 0) {
    this_01._M_head_impl =
         (this->minor_state_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState>_>
         .
         super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_false>
         ._M_head_impl;
    pMVar1 = protozero::Message::BeginNestedMessageInternal(msg,2);
    ChromeCompositorStateMachine_MinorState::Serialize(this_01._M_head_impl,pMVar1);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void ChromeCompositorStateMachine::Serialize(::protozero::Message* msg) const {
  // Field 1: major_state
  if (_has_field_[1]) {
    (*major_state_).Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: minor_state
  if (_has_field_[2]) {
    (*minor_state_).Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}